

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O3

uint32_t helper_shsubaddx_aarch64(uint32_t a,uint32_t b)

{
  return (uint)((int)(short)a + ((int)b >> 0x10)) >> 1 & 0xffff |
         (((int)a >> 0x10) - (int)(short)b & 0xfffffffeU) << 0xf;
}

Assistant:

uint32_t HELPER(glue(PFX,subaddx))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD16(a, b >> 16, 0);
    SUB16(a >> 16, b, 1);
    SET_GE;
    return res;
}